

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jglp.cpp
# Opt level: O3

void __thiscall
merlin::jglp::partition
          (jglp *this,variable VX,vector<merlin::factor,_std::allocator<merlin::factor>_> *fin,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *vin,vector<double,_std::allocator<double>_> *Norm,
          vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
          *Orig,vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                *New,flist *ids)

{
  _func_int **pp_Var1;
  _func_int **i;
  pointer pfVar2;
  pointer pdVar3;
  pointer pmVar4;
  pointer puVar5;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *pvVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  _Rb_tree_header *p_Var13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  multimap<double,_merlin::jglp::sPair,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  scores;
  map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  reverseScore;
  _func_int **local_140;
  key_type local_138;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *local_128;
  jglp *local_120;
  vector<double,_std::allocator<double>_> *local_118;
  vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_> *local_110;
  _func_int **local_108;
  variable local_100;
  _Rb_tree<double,_std::pair<const_double,_merlin::jglp::sPair>,_std::_Select1st<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  local_f0;
  factor local_c0;
  _Rb_tree<merlin::jglp::sPair,_std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>,_std::_Select1st<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  local_60;
  
  local_100.m_states = VX.m_states;
  local_100.m_label = VX.m_label;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pdVar14 = (double *)
            (ids->super_my_vector<unsigned_long>).
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_128 = fin;
  local_120 = this;
  local_118 = Norm;
  local_110 = vin;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pdVar14 !=
      (double *)
      (ids->super_my_vector<unsigned_long>).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      for (pdVar10 = (double *)
                     (ids->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; pdVar10 != pdVar14; pdVar10 = pdVar10 + 1) {
        local_c0._vptr_factor =
             (_func_int **)score(local_120,local_128,&local_100,(size_t)*pdVar14,(size_t)*pdVar10);
        pp_Var1 = (_func_int **)*pdVar14;
        local_138.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)*pdVar10;
        local_138.super_pair<unsigned_long,_unsigned_long>.first =
             local_138.super_pair<unsigned_long,_unsigned_long>.second;
        if (pp_Var1 >= local_138.super_pair<unsigned_long,_unsigned_long>.second &&
            pp_Var1 != (_func_int **)local_138.super_pair<unsigned_long,_unsigned_long>.second) {
          local_138.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)pp_Var1;
        }
        if (pp_Var1 < local_138.super_pair<unsigned_long,_unsigned_long>.second) {
          local_138.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)pp_Var1;
        }
        local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)local_138.super_pair<unsigned_long,_unsigned_long>.first;
        local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)local_138.super_pair<unsigned_long,_unsigned_long>.second;
        iVar7 = std::
                _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                          ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                            *)&local_f0,(pair<double,_merlin::jglp::sPair> *)&local_c0);
        pmVar8 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&local_60,&local_138);
        pmVar8->_M_node = iVar7._M_node;
      }
      local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*pdVar14;
      local_c0._vptr_factor = (_func_int **)0xbff0000000000000;
      local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
      iVar7 = std::
              _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
              ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                        ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                          *)&local_f0,(pair<double,_merlin::jglp::sPair> *)&local_c0);
      local_138.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)*pdVar14;
      local_138.super_pair<unsigned_long,_unsigned_long>.second =
           local_138.super_pair<unsigned_long,_unsigned_long>.first;
      pmVar8 = std::
               map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
               ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                             *)&local_60,&local_138);
      pmVar8->_M_node = iVar7._M_node;
      pdVar14 = pdVar14 + 1;
    } while (pdVar14 !=
             (double *)
             (ids->super_my_vector<unsigned_long>).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  lVar9 = std::_Rb_tree_decrement(&local_f0._M_impl.super__Rb_tree_header._M_header);
  if (0.0 < *(double *)(lVar9 + 0x20) || *(double *)(lVar9 + 0x20) == 0.0) {
    do {
      p_Var13 = &local_f0._M_impl.super__Rb_tree_header;
      lVar9 = std::_Rb_tree_decrement(&p_Var13->_M_header);
      pp_Var1 = *(_func_int ***)(lVar9 + 0x28);
      local_140 = pp_Var1;
      lVar9 = std::_Rb_tree_decrement(&p_Var13->_M_header);
      pvVar6 = local_128;
      i = *(_func_int ***)(lVar9 + 0x30);
      pfVar2 = (local_128->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
               _M_impl.super__Vector_impl_data._M_start;
      factor::binaryOpIP<merlin::factor::binOpTimes>(pfVar2 + (long)i,pfVar2 + (long)pp_Var1);
      pdVar3 = (local_118->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[(long)i] = pdVar3[(long)local_140] + pdVar3[(long)i];
      pfVar2 = (pvVar6->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar14 = pfVar2[(long)i].t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar10 = *(pointer *)
                 ((long)&pfVar2[(long)i].t_.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl + 8);
      dVar15 = -INFINITY;
      if (pdVar14 != pdVar10) {
        pdVar11 = pdVar14;
        dVar16 = -INFINITY;
        do {
          dVar15 = *pdVar11;
          if (*pdVar11 <= dVar16) {
            dVar15 = dVar16;
          }
          pdVar11 = pdVar11 + 1;
          dVar16 = dVar15;
        } while (pdVar11 != pdVar10);
        lVar9 = (long)pdVar10 - (long)pdVar14 >> 3;
        lVar12 = 0;
        do {
          pdVar14[lVar12] = (double)((ulong)(pdVar14[lVar12] / dVar15) & -(ulong)(dVar15 != 0.0));
          lVar12 = lVar12 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != lVar12);
      }
      dVar15 = log(dVar15);
      local_120->m_logz = local_120->m_logz + dVar15;
      pdVar3 = (local_118->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[(long)i] = dVar15 + pdVar3[(long)i];
      graphical_model::erase
                (&local_120->super_graphical_model,local_110,(findex)local_140,
                 &(pvVar6->super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>).
                  _M_impl.super__Vector_impl_data._M_start[(long)local_140].v_);
      factor::factor(&local_c0,1.0);
      factor::operator=((local_128->
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>)._M_impl
                        .super__Vector_impl_data._M_start + (long)local_140,&local_c0);
      factor::~factor(&local_c0);
      pmVar4 = (Orig->
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      my_set<unsigned_long>::operator|=(pmVar4 + (long)i,pmVar4 + (long)local_140);
      pmVar4 = (Orig->
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                &pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (*(pointer *)
           ((long)&pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar5)
      {
        *(pointer *)
         ((long)&pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) = puVar5;
      }
      pmVar4 = (New->
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      my_set<unsigned_long>::operator|=(pmVar4 + (long)i,pmVar4 + (long)local_140);
      pmVar4 = (New->
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                &pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (*(pointer *)
           ((long)&pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) != puVar5)
      {
        *(pointer *)
         ((long)&pmVar4[(long)local_140].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) = puVar5;
      }
      for (pdVar14 = (double *)
                     (ids->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pdVar14 !=
          (double *)
          (ids->super_my_vector<unsigned_long>).
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish; pdVar14 = pdVar14 + 1) {
        local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*pdVar14;
        local_c0._vptr_factor =
             (_func_int **)
             local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
        if (local_140 >=
            local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start &&
            local_140 !=
            (_func_int **)
            local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_c0._vptr_factor = local_140;
        }
        if (local_140 <
            local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_140;
        }
        pmVar8 = std::
                 map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                 ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                               *)&local_60,(key_type *)&local_c0);
        std::
        _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
        ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                            *)&local_f0,pmVar8->_M_node);
      }
      my_set<unsigned_long>::operator/=(ids,(unsigned_long *)&local_140);
      pdVar10 = (double *)
                (ids->super_my_vector<unsigned_long>).
                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (pdVar14 = (double *)
                     (ids->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; pdVar14 != pdVar10; pdVar14 = pdVar14 + 1) {
        if ((_func_int **)*pdVar14 != i) {
          local_108 = (_func_int **)score(local_120,local_128,&local_100,(size_t)i,(size_t)*pdVar14)
          ;
          local_138.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)*pdVar14;
          local_138.super_pair<unsigned_long,_unsigned_long>.first =
               local_138.super_pair<unsigned_long,_unsigned_long>.second;
          if (i >= local_138.super_pair<unsigned_long,_unsigned_long>.second &&
              i != (_func_int **)local_138.super_pair<unsigned_long,_unsigned_long>.second) {
            local_138.super_pair<unsigned_long,_unsigned_long>.first = (unsigned_long)i;
          }
          if (i < local_138.super_pair<unsigned_long,_unsigned_long>.second) {
            local_138.super_pair<unsigned_long,_unsigned_long>.second = (unsigned_long)i;
          }
          pmVar8 = std::
                   map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                   ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                                 *)&local_60,&local_138);
          std::
          _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
          ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                              *)&local_f0,pmVar8->_M_node);
          local_c0._vptr_factor = local_108;
          local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_138.super_pair<unsigned_long,_unsigned_long>.first;
          local_c0.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_138.super_pair<unsigned_long,_unsigned_long>.second;
          iVar7 = std::
                  _Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                  ::_M_emplace_equal<std::pair<double,merlin::jglp::sPair>>
                            ((_Rb_tree<double,std::pair<double_const,merlin::jglp::sPair>,std::_Select1st<std::pair<double_const,merlin::jglp::sPair>>,std::less<double>,std::allocator<std::pair<double_const,merlin::jglp::sPair>>>
                              *)&local_f0,(pair<double,_merlin::jglp::sPair> *)&local_c0);
          pmVar8 = std::
                   map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                   ::operator[]((map<merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
                                 *)&local_60,&local_138);
          pmVar8->_M_node = iVar7._M_node;
          pdVar10 = (double *)
                    (ids->super_my_vector<unsigned_long>).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
      }
      lVar9 = std::_Rb_tree_decrement(&local_f0._M_impl.super__Rb_tree_header._M_header);
    } while (0.0 < *(double *)(lVar9 + 0x20) || *(double *)(lVar9 + 0x20) == 0.0);
  }
  std::
  _Rb_tree<merlin::jglp::sPair,_std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>,_std::_Select1st<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>,_std::less<merlin::jglp::sPair>,_std::allocator<std::pair<const_merlin::jglp::sPair,_std::_Rb_tree_iterator<std::pair<const_double,_merlin::jglp::sPair>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<double,_std::pair<const_double,_merlin::jglp::sPair>,_std::_Select1st<std::pair<const_double,_merlin::jglp::sPair>_>,_std::less<double>,_std::allocator<std::pair<const_double,_merlin::jglp::sPair>_>_>
  ::~_Rb_tree(&local_f0);
  return;
}

Assistant:

void jglp::partition(variable VX, std::vector<factor>& fin, std::vector<flist>& vin,
		std::vector<double>& Norm, std::vector<flist>& Orig,
		std::vector<flist>& New, flist& ids) {

	// Select allocation into buckets
	typedef std::pair<double, sPair> _INS;
	std::multimap<double, sPair> scores;
	std::map<sPair, std::multimap<double, sPair>::iterator> reverseScore;

	// Populate list of pairwise scores for aggregation
	for (flistIt i = ids.begin(); i != ids.end(); ++i) {
		for (flistIt j = ids.begin(); j != i; ++j) {
			double err = score(fin, VX, *i, *j);
			sPair sp(*i, *j);
			reverseScore[sp] = scores.insert(_INS(err, sp)); // save score
		}
		reverseScore[sPair(*i, *i)] = scores.insert(
				_INS(-1, sPair(*i, *i)));    // mark self index at -1
	}

	// Run through until no more pairs can be aggregated:
	//   Find the best pair (ii,jj) according to the scoring heuristic
	//   and join them as jj; then remove ii and re-score all pairs with jj
	for (;;) {
		std::multimap<double, sPair>::reverse_iterator top = scores.rbegin();
		if (top->first < 0)
			break;                         // if can't do any more, quit
		else {
			size_t ii = top->second.first, jj = top->second.second;
//				std::cout<<"Joining "<<ii<<","<<jj<<"; size "<<(fin[ii].vars()+fin[jj].vars()).nrStates()<<"\n";
			fin[jj] *= fin[ii];                        // combine into j
			Norm[jj] += Norm[ii];
			double mx = fin[jj].max();
			fin[jj] /= mx;
			mx = std::log(mx);
			m_logz += mx;
			Norm[jj] += mx;
			erase(vin, ii, fin[ii].vars());
			fin[ii] = factor();  //   & remove i

			Orig[jj] |= Orig[ii];
			Orig[ii].clear(); // keep track of list of original factors in this cluster
			New[jj] |= New[ii];
			New[ii].clear(); //   list of new "message" clusters incoming to this cluster

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // removing entry i => remove (i,k) for all k
				scores.erase(reverseScore[sPair(ii, *k)]);
			}

			ids /= ii;

			for (flistIt k = ids.begin(); k != ids.end(); ++k) { // updated j; rescore all pairs (j,k)
				if (*k == jj)
					continue;
				double err = score(fin, VX, jj, *k);
				sPair sp(jj, *k);
				scores.erase(reverseScore[sp]);    // change score (i,j)
				reverseScore[sp] = scores.insert(_INS(err, sp));  //
			}
		}
	}
}